

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void av1_pack_tile_info(AV1_COMP *cpi,ThreadData_conflict *td,PackBSParams *pack_bs_params)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ThreadData_conflict *in_RDX;
  AV1_COMP *in_RSI;
  long in_RDI;
  int num_planes;
  uint tile_size;
  TileInfo tile_info;
  uint32_t *total_size;
  int tile_col;
  int tile_row;
  AV1_COMMON *cm;
  aom_writer mode_bc;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  TileInfo local_80;
  uint *local_68;
  int local_60;
  int local_5c;
  AV1_COMMON *local_58;
  uint local_50;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  aom_writer *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe1;
  
  local_58 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_5c = (in_RDX->mb).plane[0].src.stride;
  local_60 = *(int *)&(in_RDX->mb).plane[0].src.field_0x1c;
  local_68 = (uint *)(in_RDX->mb).plane[0].coeff;
  av1_tile_set_col(&local_80,local_58,local_60);
  av1_tile_set_row(&local_80,local_58,local_5c);
  bVar1 = (local_58->features).disable_cdf_update ^ 0xff;
  bVar2 = bVar1 & 1;
  iVar3 = av1_num_planes(local_58);
  av1_reset_loop_restoration
            ((MACROBLOCKD *)CONCAT17(bVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c);
  (in_RDX->mb).plane[0].dqcoeff =
       (tran_low_t *)((long)(in_RDX->mb).plane[0].eobs + (ulong)*local_68);
  if (*(int *)&(in_RDX->mb).plane[0].quant_fp_QTX == 0) {
    *local_68 = *local_68 + 4;
  }
  aom_start_encode((aom_writer *)CONCAT17(bVar1,in_stack_ffffffffffffff70),
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  write_modes(in_RSI,in_RDX,(TileInfo *)CONCAT71(in_stack_ffffffffffffffe1,bVar2),
              in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  iVar3 = aom_stop_encode((aom_writer *)CONCAT44(in_stack_ffffffffffffff7c,iVar3));
  if (iVar3 < 0) {
    aom_internal_error(*(aom_internal_error_info **)
                        (in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb8],AOM_CODEC_ERROR,
                       "Error writing modes");
  }
  (in_RDX->mb).plane[0].qcoeff = (tran_low_t *)(ulong)local_50;
  if (*(int *)&(in_RDX->mb).plane[0].quant_fp_QTX == 0) {
    mem_put_le32_as_int((in_RDX->mb).plane[0].dqcoeff,local_50 - 1);
  }
  return;
}

Assistant:

void av1_pack_tile_info(AV1_COMP *const cpi, ThreadData *const td,
                        PackBSParams *const pack_bs_params) {
  aom_writer mode_bc;
  AV1_COMMON *const cm = &cpi->common;
  int tile_row = pack_bs_params->tile_row;
  int tile_col = pack_bs_params->tile_col;
  uint32_t *const total_size = pack_bs_params->total_size;
  TileInfo tile_info;
  av1_tile_set_col(&tile_info, cm, tile_col);
  av1_tile_set_row(&tile_info, cm, tile_row);
  mode_bc.allow_update_cdf = 1;
  mode_bc.allow_update_cdf =
      mode_bc.allow_update_cdf && !cm->features.disable_cdf_update;

  unsigned int tile_size;

  const int num_planes = av1_num_planes(cm);
  av1_reset_loop_restoration(&td->mb.e_mbd, num_planes);

  pack_bs_params->buf.data = pack_bs_params->dst + *total_size;

  // The last tile of the tile group does not have a header.
  if (!pack_bs_params->is_last_tile_in_tg) *total_size += 4;

  // Pack tile data
  aom_start_encode(&mode_bc, pack_bs_params->dst + *total_size);
  write_modes(cpi, td, &tile_info, &mode_bc, tile_row, tile_col);
  if (aom_stop_encode(&mode_bc) < 0) {
    aom_internal_error(td->mb.e_mbd.error_info, AOM_CODEC_ERROR,
                       "Error writing modes");
  }
  tile_size = mode_bc.pos;
  assert(tile_size >= AV1_MIN_TILE_SIZE_BYTES);

  pack_bs_params->buf.size = tile_size;

  // Write tile size
  if (!pack_bs_params->is_last_tile_in_tg) {
    // size of this tile
    mem_put_le32(pack_bs_params->buf.data, tile_size - AV1_MIN_TILE_SIZE_BYTES);
  }
}